

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.cpp
# Opt level: O0

void __thiscall
channel::channel(channel *this,int _fd,uint32_t _Sevent,Handle _read,Handle _write,
                TimeRound<channel> *_time_round)

{
  char *pcVar1;
  ulong uVar2;
  TimeRound<channel> *_time_round_local;
  Handle _write_local;
  Handle _read_local;
  uint32_t _Sevent_local;
  int _fd_local;
  channel *this_local;
  
  std::enable_shared_from_this<channel>::enable_shared_from_this
            (&this->super_enable_shared_from_this<channel>);
  this->_vptr_channel = (_func_int **)&PTR__channel_00141ad8;
  this->fd = _fd;
  this->Sevent = _Sevent;
  this->read = _read;
  this->write = _write;
  this->accept_epoll = (Epoll *)0x0;
  this->attach_epoll = (Epoll *)0x0;
  this->time_round = _time_round;
  std::weak_ptr<TimeRoundItem<channel>_>::weak_ptr(&this->wp_time_round_item);
  *(undefined4 *)((long)&(this->epevent).data + 4) = 0;
  *(undefined8 *)&this->epevent = 0;
  this->max_read_write_buff_length = 0x1000;
  uVar2 = (ulong)this->max_read_write_buff_length;
  if ((long)uVar2 < 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pcVar1 = (char *)operator_new__(uVar2);
  this->read_buff = pcVar1;
  uVar2 = (ulong)this->max_read_write_buff_length;
  if ((long)uVar2 < 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pcVar1 = (char *)operator_new__(uVar2);
  this->write_buff = pcVar1;
  this->read_length = 0;
  this->write_length = 0;
  (this->epevent).data.fd = _fd;
  (this->epevent).events = this->Sevent;
  return;
}

Assistant:

channel::channel(int _fd,uint32_t _Sevent,Handle _read,Handle _write,TimeRound<channel>* _time_round):
epevent(),fd(_fd),Sevent(_Sevent),write(_write),read(_read),attach_epoll(nullptr),accept_epoll(nullptr),time_round(_time_round)
{
    max_read_write_buff_length = 4096;
    read_buff = new char[max_read_write_buff_length];
    write_buff = new char[max_read_write_buff_length];
    read_length = 0;
    write_length = 0;
    epevent.data.fd = _fd;
    epevent.events = Sevent;
}